

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftsdf.c
# Opt level: O0

SDF_Contour_Orientation get_contour_orientation(SDF_Contour *contour)

{
  SDF_Edge_Type SVar1;
  int local_24;
  SDF_Edge *pSStack_20;
  FT_26D6 area;
  SDF_Edge *head;
  SDF_Contour *contour_local;
  
  local_24 = 0;
  if ((contour == (SDF_Contour *)0x0) || (contour->edges == (SDF_Edge *)0x0)) {
    contour_local._4_4_ = SDF_ORIENTATION_NONE;
  }
  else {
    for (pSStack_20 = contour->edges; pSStack_20 != (SDF_Edge *)0x0; pSStack_20 = pSStack_20->next)
    {
      SVar1 = pSStack_20->edge_type;
      if (SVar1 == SDF_EDGE_LINE) {
        local_24 = local_24 +
                   (int)((((pSStack_20->end_pos).x - (pSStack_20->start_pos).x) *
                         ((pSStack_20->end_pos).y + (pSStack_20->start_pos).y)) / 0x40);
      }
      else if (SVar1 == SDF_EDGE_CONIC) {
        local_24 = local_24 +
                   (int)((((pSStack_20->control_a).x - (pSStack_20->start_pos).x) *
                         ((pSStack_20->control_a).y + (pSStack_20->start_pos).y)) / 0x40) +
                   (int)((((pSStack_20->end_pos).x - (pSStack_20->control_a).x) *
                         ((pSStack_20->end_pos).y + (pSStack_20->control_a).y)) / 0x40);
      }
      else {
        if (SVar1 != SDF_EDGE_CUBIC) {
          return SDF_ORIENTATION_NONE;
        }
        local_24 = local_24 +
                   (int)((((pSStack_20->control_a).x - (pSStack_20->start_pos).x) *
                         ((pSStack_20->control_a).y + (pSStack_20->start_pos).y)) / 0x40) +
                   (int)((((pSStack_20->control_b).x - (pSStack_20->control_a).x) *
                         ((pSStack_20->control_b).y + (pSStack_20->control_a).y)) / 0x40) +
                   (int)((((pSStack_20->end_pos).x - (pSStack_20->control_b).x) *
                         ((pSStack_20->end_pos).y + (pSStack_20->control_b).y)) / 0x40);
      }
    }
    if (local_24 < 1) {
      contour_local._4_4_ = SDF_ORIENTATION_CCW;
    }
    else {
      contour_local._4_4_ = SDF_ORIENTATION_CW;
    }
  }
  return contour_local._4_4_;
}

Assistant:

static SDF_Contour_Orientation
  get_contour_orientation ( SDF_Contour*  contour )
  {
    SDF_Edge*  head = NULL;
    FT_26D6    area = 0;


    /* return none if invalid parameters */
    if ( !contour || !contour->edges )
      return SDF_ORIENTATION_NONE;

    head = contour->edges;

    /* Calculate the area of the control box for all edges. */
    while ( head )
    {
      switch ( head->edge_type )
      {
      case SDF_EDGE_LINE:
        area += MUL_26D6( ( head->end_pos.x - head->start_pos.x ),
                          ( head->end_pos.y + head->start_pos.y ) );
        break;

      case SDF_EDGE_CONIC:
        area += MUL_26D6( head->control_a.x - head->start_pos.x,
                          head->control_a.y + head->start_pos.y );
        area += MUL_26D6( head->end_pos.x - head->control_a.x,
                          head->end_pos.y + head->control_a.y );
        break;

      case SDF_EDGE_CUBIC:
        area += MUL_26D6( head->control_a.x - head->start_pos.x,
                          head->control_a.y + head->start_pos.y );
        area += MUL_26D6( head->control_b.x - head->control_a.x,
                          head->control_b.y + head->control_a.y );
        area += MUL_26D6( head->end_pos.x - head->control_b.x,
                          head->end_pos.y + head->control_b.y );
        break;

      default:
        return SDF_ORIENTATION_NONE;
      }

      head = head->next;
    }

    /* Clockwise contours cover a positive area, and counter-clockwise */
    /* contours cover a negative area.                                 */
    if ( area > 0 )
      return SDF_ORIENTATION_CW;
    else
      return SDF_ORIENTATION_CCW;
  }